

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O2

bool __thiscall ON_Sun::CImpl::SetLocalDateTime(CImpl *this,int year,int month,int day,double hours)

{
  int iVar1;
  int month_00;
  ON_XMLVariant local_120;
  
  if (0x896 < year) {
    year = 0x897;
  }
  if (year < 0x7b4) {
    year = 0x7b3;
  }
  month_00 = 0xc;
  if (month < 0xc) {
    month_00 = month;
  }
  if (month_00 < 2) {
    month_00 = 1;
  }
  iVar1 = ON_SunEngine::DaysInMonth(month_00,year);
  if (iVar1 < day) {
    day = iVar1;
  }
  if (day < 2) {
    day = 1;
  }
  ::ON_XMLVariant::ON_XMLVariant(&local_120,year);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"year"
             ,&local_120);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,month_00);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",
             L"month",&local_120);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,day);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"day",
             &local_120);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,hours);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"time"
             ,&local_120);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  this->_calc_dirty = true;
  return true;
}

Assistant:

bool ON_Sun::CImpl::SetLocalDateTime(int year, int month, int day, double hours)
{
  year  = std::max(MinYear(), std::min(MaxYear(), year));
  month = std::max(1, std::min(12, month));
  day   = std::max(1, std::min(ON_SunEngine::DaysInMonth(month, year), day));

  const wchar_t* s = XMLPath_Sun();
  SetParameter(s, ON_RDK_SUN_DATE_YEAR,  year);
  SetParameter(s, ON_RDK_SUN_DATE_MONTH, month);
  SetParameter(s, ON_RDK_SUN_DATE_DAY,   day);
  SetParameter(s, ON_RDK_SUN_TIME_HOURS, hours);

  _calc_dirty = true;

  return true;
}